

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfers.c
# Opt level: O1

transfer_type_t parse_transfer_type(char *value)

{
  int iVar1;
  transfer_type_t tVar2;
  
  iVar1 = strcmp(value,"0");
  tVar2 = TT_RECOMMENDED;
  if ((iVar1 != 0) && (*value != '\0')) {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      tVar2 = TT_TIMED;
    }
    else {
      iVar1 = strcmp(value,"2");
      if (iVar1 == 0) {
        tVar2 = TT_TIME_REQUIRED;
      }
      else {
        iVar1 = strcmp(value,"3");
        tVar2 = TT_NOT_SET - (iVar1 == 0);
      }
    }
  }
  return tVar2;
}

Assistant:

transfer_type_t parse_transfer_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return TT_RECOMMENDED;
    else if (strcmp(value, "1") == 0)
        return TT_TIMED;
    else if (strcmp(value, "2") == 0)
        return TT_TIME_REQUIRED;
    else if (strcmp(value, "3") == 0)
        return TT_NOT_POSSIBLE;
    else
        return TT_NOT_SET;
}